

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::select_base::selected_id(select_base *this,string *id)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  cppcms_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint i;
  string *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  uint local_14;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_14 = 0;
    while( true ) {
      sVar3 = std::
              vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
              ::size((vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                      *)(in_RDI + 0x10));
      if (sVar3 <= local_14) {
        this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
        cppcms_error::cppcms_error(this_00,in_stack_ffffffffffffff88);
        __cxa_throw(this_00,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
      }
      std::
      vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
      ::operator[]((vector<cppcms::widgets::select_base::element,_std::allocator<cppcms::widgets::select_base::element>_>
                    *)(in_RDI + 0x10),(ulong)local_14);
      _Var1 = std::operator==(in_RDI,in_RSI);
      if (_Var1) break;
      local_14 = local_14 + 1;
    }
    *(uint *)(in_RDI + 0x11) = local_14;
    *(uint *)&in_RDI[0x11].field_0x4 = local_14;
  }
  else {
    *(undefined4 *)(in_RDI + 0x11) = 0xffffffff;
    *(undefined4 *)&in_RDI[0x11].field_0x4 = 0xffffffff;
  }
  return;
}

Assistant:

void select_base::selected_id(std::string id)
{
	if(id.empty()) {
		selected_ = -1;
		default_selected_ = -1;
		return;
	}
	for(unsigned i=0;i<elements_.size();i++) {
		if(id==elements_[i].id) {
			selected_ = i;
			default_selected_ = i;
			return;
		}
	}
	throw cppcms_error("Select base::invalid index: " + id);
}